

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O3

PermutationMatrix<_1,__1,_int> * __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::applyTranspositionOnTheRight
          (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this,Index i,Index j)

{
  undefined4 uVar1;
  long lVar2;
  
  if (-1 < (j | i)) {
    if ((i < *(int *)(this + 8)) && (j < *(int *)(this + 8))) {
      lVar2 = *(long *)this;
      uVar1 = *(undefined4 *)(lVar2 + (ulong)(uint)i * 4);
      *(undefined4 *)(lVar2 + (ulong)(uint)i * 4) = *(undefined4 *)(lVar2 + (ulong)(uint)j * 4);
      *(undefined4 *)(lVar2 + (ulong)(uint)j * 4) = uVar1;
      return (PermutationMatrix<_1,__1,_int> *)this;
    }
  }
  __assert_fail("i>=0 && j>=0 && i<size() && j<size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/PermutationMatrix.h"
                ,0xc0,
                "Derived &Eigen::PermutationBase<Eigen::PermutationMatrix<-1, -1>>::applyTranspositionOnTheRight(Index, Index) [Derived = Eigen::PermutationMatrix<-1, -1>]"
               );
}

Assistant:

Derived& applyTranspositionOnTheRight(Index i, Index j)
    {
      eigen_assert(i>=0 && j>=0 && i<size() && j<size());
      std::swap(indices().coeffRef(i), indices().coeffRef(j));
      return derived();
    }